

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

void cram_ref_decr(refs_t *r,int id)

{
  long lVar1;
  int iVar2;
  ref_entry **pprVar3;
  long lVar4;
  char *__ptr;
  ref_entry *prVar5;
  
  pthread_mutex_lock((pthread_mutex_t *)&r->lock);
  pprVar3 = r->ref_id;
  if (id < 0) {
    prVar5 = pprVar3[id];
  }
  else {
    prVar5 = pprVar3[(uint)id];
    if (prVar5->seq != (char *)0x0) {
      lVar4 = prVar5->count;
      lVar1 = lVar4 + -1;
      prVar5->count = lVar1;
      if (lVar4 < 2) {
        if (lVar1 != 0) {
          __assert_fail("r->ref_id[id]->count == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                        ,0x82b,"void cram_ref_decr_locked(refs_t *, int)");
        }
        if (((-1 < (long)r->last_id) && (pprVar3[r->last_id]->count < 1)) &&
           (__ptr = pprVar3[r->last_id]->seq, __ptr != (char *)0x0)) {
          free(__ptr);
          pprVar3 = r->ref_id;
          iVar2 = r->last_id;
          pprVar3[iVar2]->seq = (char *)0x0;
          pprVar3[iVar2]->length = 0;
        }
        r->last_id = id;
      }
      goto LAB_0011c8b9;
    }
  }
  if (prVar5->count < 0) {
    __assert_fail("r->ref_id[id]->count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                  ,0x826,"void cram_ref_decr_locked(refs_t *, int)");
  }
LAB_0011c8b9:
  pthread_mutex_unlock((pthread_mutex_t *)&r->lock);
  return;
}

Assistant:

void cram_ref_decr(refs_t *r, int id) {
    pthread_mutex_lock(&r->lock);
    cram_ref_decr_locked(r, id);
    pthread_mutex_unlock(&r->lock);
}